

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::vprint(FILE *f,string_view fmt,format_args args)

{
  bool bVar1;
  value_type_conflict1 vVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  file_print_buffer<_IO_FILE,_void> *in_R8;
  buffer<char> *in_stack_00000018;
  locale_ref in_stack_00000020;
  undefined1 in_stack_00000028 [16];
  string_view in_stack_00000038;
  file_print_buffer<_IO_FILE,_void> *buffer;
  FILE *in_stack_000001a0;
  undefined1 in_stack_000001a8 [16];
  undefined1 in_stack_000001b8 [16];
  _IO_FILE *in_stack_ffffffffffffff28;
  glibc_file<_IO_FILE> *in_stack_ffffffffffffff30;
  undefined1 *puVar3;
  _IO_FILE *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff44;
  locale_ref local_b0;
  undefined8 local_a8;
  undefined1 local_88 [40];
  undefined1 *local_60;
  undefined8 local_58;
  file_print_buffer<_IO_FILE,_void> *local_50;
  undefined8 local_48;
  undefined8 local_40;
  integral_constant local_31;
  glibc_file<_IO_FILE> local_30 [2];
  undefined8 local_20;
  file_print_buffer<_IO_FILE,_void> *pfStack_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_20 = in_RCX;
  pfStack_18 = in_R8;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  detail::glibc_file<_IO_FILE>::file_base(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  bVar1 = detail::glibc_file<_IO_FILE>::is_buffered(local_30);
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff40);
  if (bVar1) {
    vVar2 = std::integral_constant::operator_cast_to_bool(&local_31);
    uVar4 = CONCAT13(vVar2,(int3)uVar4) ^ 0xff000000;
  }
  if ((uVar4 & 0x1000000) == 0) {
    puVar3 = local_88;
    detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
              ((file_print_buffer<_IO_FILE,_void> *)CONCAT44(in_stack_ffffffffffffff44,uVar4),
               in_stack_ffffffffffffff38);
    local_a8 = local_20;
    local_60 = puVar3;
    detail::locale_ref::locale_ref(&local_b0);
    detail::vformat_to(in_stack_00000018,in_stack_00000038,(format_args)in_stack_00000028,
                       in_stack_00000020);
    detail::file_print_buffer<_IO_FILE,_void>::~file_print_buffer(pfStack_18);
  }
  else {
    local_48 = local_10;
    local_40 = uStack_8;
    local_58 = local_20;
    local_50 = pfStack_18;
    vprint_buffered(in_stack_000001a0,(string_view)in_stack_000001b8,(format_args)in_stack_000001a8)
    ;
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view fmt, format_args args) {
  if (!detail::file_ref(f).is_buffered() || !detail::has_flockfile<>())
    return vprint_buffered(f, fmt, args);
  auto&& buffer = detail::file_print_buffer<>(f);
  return detail::vformat_to(buffer, fmt, args);
}